

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBook.c
# Opt level: O3

void Io_WriteBook(Abc_Ntk_t *pNtk,char *FileName)

{
  Abc_Ntk_t *pNtk_00;
  undefined8 uVar1;
  undefined8 *puVar2;
  long *plVar3;
  Abc_Obj_t *pNode;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  double dVar12;
  long lVar13;
  undefined8 *puVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  size_t sVar18;
  char *pcVar19;
  FILE *pFVar20;
  FILE *pFVar21;
  FILE *pFVar22;
  Abc_Des_t *pAVar23;
  int *piVar24;
  void *pvVar25;
  void *pvVar26;
  uint *puVar27;
  ProgressBar *p;
  uint *puVar28;
  int *__s;
  char *pcVar29;
  Vec_Ptr_t *pVVar30;
  uint uVar31;
  uint uVar32;
  ulong uVar33;
  long *plVar34;
  uint uVar35;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int Fill;
  undefined8 *puVar36;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  int iVar37;
  ulong uVar38;
  long *plVar39;
  ulong uVar40;
  int iVar41;
  uint uVar42;
  uint uVar43;
  size_t sVar44;
  long lVar45;
  uint uVar46;
  ulong uVar47;
  long lVar48;
  bool bVar49;
  ulong uVar50;
  ulong uVar51;
  undefined4 uVar52;
  undefined4 uVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  double dStack_140;
  uint local_12c;
  double local_128;
  double dStack_120;
  ulong local_f8;
  long *local_f0;
  uint local_e4;
  ulong local_d0;
  ulong local_b8;
  undefined4 local_a8;
  
  sVar18 = strlen(FileName);
  pcVar19 = (char *)calloc(sVar18 + 7,1);
  if (pNtk->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteBook.c"
                  ,0x6e,"void Io_WriteBook(Abc_Ntk_t *, char *)");
  }
  strcpy(pcVar19,FileName);
  sVar18 = strlen(pcVar19);
  builtin_strncpy(pcVar19 + sVar18,".nodes",7);
  pFVar20 = fopen(pcVar19,"w");
  strcpy(pcVar19,FileName);
  sVar18 = strlen(pcVar19);
  builtin_strncpy(pcVar19 + sVar18,".nets",6);
  pFVar21 = fopen(pcVar19,"w");
  strcpy(pcVar19,FileName);
  sVar18 = strlen(pcVar19);
  builtin_strncpy(pcVar19 + sVar18,".aux",5);
  pFVar22 = fopen(pcVar19,"w");
  if ((pFVar21 == (FILE *)0x0 || pFVar20 == (FILE *)0x0) || pFVar22 == (FILE *)0x0) {
    fclose(pFVar22);
    fwrite("Io_WriteBook(): Cannot open the output files.\n",0x2e,1,_stdout);
    return;
  }
  fprintf(pFVar22,"RowBasedPlacement : %s.nodes %s.nets %s.scl %s.pl %s.wts",FileName,FileName,
          FileName,FileName,FileName);
  fclose(pFVar22);
  uVar15 = Io_NtkWriteNodes((FILE *)pFVar20,pNtk);
  Io_NtkWriteNets((FILE *)pFVar21,pNtk);
  if (pNtk->pExdc != (Abc_Ntk_t *)0x0) {
    uVar16 = Io_NtkWriteNodes((FILE *)pFVar20,pNtk);
    uVar15 = uVar15 + uVar16;
    Io_NtkWriteNets((FILE *)pFVar21,pNtk);
  }
  if (pNtk->nObjCounts[9] != 0) {
    __assert_fail("Abc_NtkWhiteboxNum(pNtk) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteBook.c"
                  ,0x8f,"void Io_WriteBook(Abc_Ntk_t *, char *)");
  }
  if (0 < pNtk->nObjCounts[10]) {
    pAVar23 = pNtk->pDesign;
    pVVar30 = pAVar23->vModules;
    if (0 < pVVar30->nSize) {
      lVar45 = 0;
      do {
        pNtk_00 = (Abc_Ntk_t *)pVVar30->pArray[lVar45];
        if (pNtk_00 != pNtk) {
          uVar16 = Io_NtkWriteNodes((FILE *)pFVar20,pNtk_00);
          uVar15 = uVar15 + uVar16;
          Io_NtkWriteNets((FILE *)pFVar21,pNtk_00);
          pAVar23 = pNtk->pDesign;
        }
        lVar45 = lVar45 + 1;
        pVVar30 = pAVar23->vModules;
      } while (lVar45 < pVVar30->nSize);
    }
  }
  fclose(pFVar20);
  fclose(pFVar21);
  strcpy(pcVar19,FileName);
  sVar18 = strlen(pcVar19);
  builtin_strncpy(pcVar19 + sVar18,".scl",5);
  pFVar20 = fopen(pcVar19,"w");
  strcpy(pcVar19,FileName);
  sVar18 = strlen(pcVar19);
  builtin_strncpy(pcVar19 + sVar18,".pl",4);
  pFVar21 = fopen(pcVar19,"w");
  strcpy(pcVar19,FileName);
  sVar18 = strlen(pcVar19);
  builtin_strncpy(pcVar19 + sVar18,".wts",5);
  pFVar22 = fopen(pcVar19,"w");
  free(pcVar19);
  iVar17 = pNtk->nObjCounts[8];
  dVar6 = (double)uVar15;
  dStack_120 = local_128;
  local_128 = dVar6;
  dVar10 = dVar6 / 0.9;
  uVar43 = (uint)SQRT(dVar10);
  iVar41 = pNtk->nObjCounts[7];
  uVar16 = pNtk->vPos->nSize + pNtk->vPis->nSize;
  uVar40 = (ulong)uVar16;
  dVar11 = (double)uVar43;
  dVar7 = (double)(int)(dVar10 / dVar11);
  dVar12 = dVar11 * dVar7;
  printf("Core cell height(==site height) is %d\n",1);
  uVar38 = (ulong)(uint)(iVar17 + iVar41);
  printf("Total core cell width is %d giving an ave width of %f\n",
         SUB84((double)(uVar15 / uVar38),0),(ulong)uVar15,(ulong)uVar15 % uVar38);
  puts("Target Dimensions:");
  printf("  Area  :   %f\n",SUB84(dVar10,0));
  printf("  WS%%   :   %f\n",0);
  printf("  AR    :   %f\n",0);
  puts("Actual Dimensions:");
  local_a8 = SUB84(dVar7,0);
  printf("  Width :   %f\n",local_a8);
  printf("  Height:   %f (%d rows)\n",SUB84(dVar11,0),(ulong)uVar43);
  printf("  Area  :   %f\n",SUB84(dVar12,0));
  printf("  WS%%   :   %f\n",SUB84(((dVar12 - dVar6) * 100.0) / dVar12,0));
  printf("  AR    :   %f\n\n",SUB84(dVar7 / dVar11,0));
  fwrite("UCLA    scl    1.0\n\n",0x14,1,pFVar20);
  fprintf(pFVar20,"Numrows : %d\n\n",(ulong)uVar43);
  if (uVar43 != 0) {
    uVar38 = 0;
    do {
      fwrite("CoreRow Horizontal\n",0x13,1,pFVar20);
      fprintf(pFVar20," Coordinate   : \t%d\n",uVar38);
      fprintf(pFVar20," Height       : \t%d\n",1);
      fprintf(pFVar20," Sitewidth    : \t%d\n",1);
      fprintf(pFVar20," Sitespacing  : \t%d\n",1);
      fprintf(pFVar20," Siteorient   : \t%s\n",
              &DAT_009accfc + *(int *)(&DAT_009accfc + (ulong)((uint)uVar38 & 1) * 4));
      fprintf(pFVar20," Sitesymmetry : \t%c\n",0x59);
      fprintf(pFVar20," SubrowOrigin : \t%d Numsites :    \t%d\n",0,
              (ulong)(uint)(int)(dVar10 / dVar11));
      fwrite("End\n",4,1,pFVar20);
      uVar15 = (uint)uVar38 + 1;
      uVar38 = (ulong)uVar15;
    } while (uVar43 != uVar15);
  }
  piVar24 = (int *)malloc(0x10);
  uVar38 = 8;
  if (6 < uVar16 - 1) {
    uVar38 = uVar40;
  }
  piVar24[1] = 0;
  iVar17 = (int)uVar38;
  *piVar24 = iVar17;
  uVar47 = 0;
  if (iVar17 == 0) {
    pvVar25 = (void *)0x0;
  }
  else {
    pvVar25 = malloc((long)iVar17 << 3);
  }
  uVar15 = (uint)((dVar11 / (dVar11 + dVar11 + dVar7 + dVar7)) * (double)uVar40);
  uVar51 = (ulong)uVar15;
  *(void **)(piVar24 + 2) = pvVar25;
  uVar43 = uVar16 + uVar15 * -2;
  dVar6 = ceil((double)uVar43 * 0.5);
  pVVar30 = pNtk->vPis;
  if (0 < pVVar30->nSize) {
    sVar18 = 0;
    uVar47 = 0;
    do {
      pvVar25 = pVVar30->pArray[uVar47];
      if ((int)uVar47 == (int)uVar38) {
        pvVar26 = *(void **)(piVar24 + 2);
        if (uVar47 < 0x10) {
          if (pvVar26 == (void *)0x0) {
            pvVar26 = malloc(0x80);
          }
          else {
            pvVar26 = realloc(pvVar26,0x80);
          }
          *(void **)(piVar24 + 2) = pvVar26;
          uVar38 = 0x10;
        }
        else {
          if (pvVar26 == (void *)0x0) {
            pvVar26 = malloc(sVar18);
          }
          else {
            pvVar26 = realloc(pvVar26,sVar18);
          }
          *(void **)(piVar24 + 2) = pvVar26;
          uVar38 = (ulong)(uint)((int)uVar38 * 2);
        }
      }
      else {
        pvVar26 = *(void **)(piVar24 + 2);
      }
      *(void **)((long)pvVar26 + uVar47 * 8) = pvVar25;
      uVar47 = uVar47 + 1;
      pVVar30 = pNtk->vPis;
      sVar18 = sVar18 + 0x10;
    } while ((long)uVar47 < (long)pVVar30->nSize);
    piVar24[1] = (int)uVar47;
    *piVar24 = (int)uVar38;
  }
  pVVar30 = pNtk->vPos;
  if (0 < pVVar30->nSize) {
    lVar48 = (long)(int)uVar47;
    sVar18 = lVar48 << 4;
    lVar45 = 0;
    do {
      pvVar25 = pVVar30->pArray[lVar45];
      if ((int)(lVar48 + lVar45) == (int)uVar38) {
        pvVar26 = *(void **)(piVar24 + 2);
        if ((ulong)(lVar48 + lVar45) < 0x10) {
          if (pvVar26 == (void *)0x0) {
            pvVar26 = malloc(0x80);
          }
          else {
            pvVar26 = realloc(pvVar26,0x80);
          }
          *(void **)(piVar24 + 2) = pvVar26;
          uVar38 = 0x10;
        }
        else {
          if (pvVar26 == (void *)0x0) {
            pvVar26 = malloc(sVar18);
          }
          else {
            pvVar26 = realloc(pvVar26,sVar18);
          }
          *(void **)(piVar24 + 2) = pvVar26;
          uVar38 = (ulong)(uint)((int)uVar38 * 2);
        }
      }
      else {
        pvVar26 = *(void **)(piVar24 + 2);
      }
      *(void **)((long)pvVar26 + lVar45 * 8 + lVar48 * 8) = pvVar25;
      lVar45 = lVar45 + 1;
      pVVar30 = pNtk->vPos;
      sVar18 = sVar18 + 0x10;
    } while (lVar45 < pVVar30->nSize);
    uVar46 = (int)uVar47 + (int)lVar45;
    uVar47 = (ulong)uVar46;
    piVar24[1] = uVar46;
    *piVar24 = (int)uVar38;
  }
  uVar38 = uVar47 & 0xffffffff;
  pvVar25 = malloc(uVar38 * 4);
  puVar27 = (uint *)malloc(0x10);
  uVar46 = (uint)uVar47;
  uVar31 = 8;
  if (6 < uVar46 - 1) {
    uVar31 = uVar46;
  }
  puVar27[1] = 0;
  *puVar27 = uVar31;
  if (uVar31 == 0) {
    pvVar26 = (void *)0x0;
  }
  else {
    pvVar26 = malloc((long)(int)uVar31 << 3);
  }
  local_d0 = (ulong)uVar31;
  *(void **)(puVar27 + 2) = pvVar26;
  if (uVar38 != 0) {
    uVar35 = 0;
    memset(pvVar25,0,uVar38 * 4);
    if (0 < (int)uVar46) {
      local_f0 = (long *)**(undefined8 **)(piVar24 + 2);
      p = Extra_ProgressBarStart((FILE *)_stdout,uVar46);
      local_12c = 0;
      if (uVar38 != 1) {
        sVar18 = local_d0 << 3;
        bVar49 = true;
        local_b8 = 1;
        uVar35 = 0;
        local_12c = 0;
        local_e4 = uVar31;
        do {
          uVar32 = (uint)local_b8;
          local_b8 = local_b8 & 0xffffffff;
          if ((int)uVar32 <= (int)uVar46) {
            uVar32 = uVar46;
          }
          while ((uVar42 = (uint)local_b8, !bVar49 &&
                 (*(int *)((long)pvVar25 + (ulong)*(uint *)(local_f0 + 2) * 4) != 0))) {
            if (uVar32 == uVar42) goto LAB_00343dcd;
            local_f0 = *(long **)(*(long *)(piVar24 + 2) + local_b8 * 8);
            local_b8 = local_b8 + 1;
            bVar49 = false;
            if (uVar38 <= local_b8) goto LAB_003436d4;
          }
          if (0 < (int)uVar35) {
            uVar47 = 0;
            do {
              if (*(long **)(*(long *)(puVar27 + 2) + uVar47 * 8) == local_f0) goto LAB_00342e09;
              uVar47 = uVar47 + 1;
            } while (uVar35 != uVar47);
          }
          if (uVar35 == local_e4) {
            if ((int)uVar35 < 0x10) {
              if (*(void **)(puVar27 + 2) == (void *)0x0) {
                pvVar26 = malloc(0x80);
              }
              else {
                pvVar26 = realloc(*(void **)(puVar27 + 2),0x80);
              }
              *(void **)(puVar27 + 2) = pvVar26;
              *puVar27 = 0x10;
              local_d0 = 0x10;
              local_e4 = 0x10;
            }
            else {
              local_e4 = uVar35 * 2;
              local_d0 = (ulong)local_e4;
              if (*(void **)(puVar27 + 2) == (void *)0x0) {
                pvVar26 = malloc(local_d0 * 8);
              }
              else {
                pvVar26 = realloc(*(void **)(puVar27 + 2),local_d0 * 8);
              }
              *(void **)(puVar27 + 2) = pvVar26;
              *puVar27 = local_e4;
            }
          }
          else {
            pvVar26 = *(void **)(puVar27 + 2);
          }
          lVar45 = (long)(int)uVar35;
          uVar35 = uVar35 + 1;
          puVar27[1] = uVar35;
          *(long **)((long)pvVar26 + lVar45 * 8) = local_f0;
          *(undefined4 *)((long)pvVar25 + (ulong)*(uint *)(local_f0 + 2) * 4) = 1;
          local_12c = local_12c + 1;
LAB_00342e09:
          puVar28 = (uint *)malloc(0x10);
          puVar28[1] = 0;
          *puVar28 = uVar31;
          pvVar26 = malloc(sVar18);
          *(void **)(puVar28 + 2) = pvVar26;
          if ((*(uint *)((long)local_f0 + 0x14) & 0xe) != 2) {
            __assert_fail("Abc_ObjIsPi(pTerm) || Abc_ObjIsPo(pTerm)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteBook.c"
                          ,0x312,
                          "Abc_Obj_t *Io_NtkBfsPads(Abc_Ntk_t *, Abc_Obj_t *, unsigned int, int *)")
            ;
          }
          iVar17 = extraout_EDX;
          if ((pNtk->vTravIds).pArray == (int *)0x0) {
            iVar41 = pNtk->vObjs->nSize;
            uVar47 = (long)iVar41 + 500;
            iVar37 = (int)uVar47;
            if ((pNtk->vTravIds).nCap < iVar37) {
              __s = (int *)malloc(uVar47 * 4);
              (pNtk->vTravIds).pArray = __s;
              if (__s == (int *)0x0) {
                __assert_fail("p->pArray",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                              ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
              }
              (pNtk->vTravIds).nCap = iVar37;
              iVar17 = extraout_EDX_00;
            }
            else {
              __s = (int *)0x0;
            }
            if (-500 < iVar41) {
              memset(__s,0,(uVar47 & 0xffffffff) << 2);
              iVar17 = extraout_EDX_01;
            }
            (pNtk->vTravIds).nSize = iVar37;
          }
          iVar41 = pNtk->nTravIds;
          pNtk->nTravIds = iVar41 + 1;
          if (0x3ffffffe < iVar41) {
            __assert_fail("p->nTravIds < (1<<30)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                          ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
          }
          lVar45 = *local_f0;
          iVar41 = (int)local_f0[2];
          uVar52 = *(undefined4 *)(lVar45 + 0xd8);
          Vec_IntFillExtra((Vec_Int_t *)(lVar45 + 0xe0),iVar41 + 1,iVar17);
          if (((long)iVar41 < 0) || (*(int *)(lVar45 + 0xe4) <= iVar41)) {
LAB_00343dec:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          *(undefined4 *)(*(long *)(lVar45 + 0xe8) + (long)iVar41 * 4) = uVar52;
          lVar45 = *(long *)(*(long *)(*local_f0 + 0x20) + 8);
          plVar39 = local_f0;
          if ((*(uint *)((long)local_f0 + 0x14) & 0xf) == 2) {
            plVar34 = *(long **)(lVar45 + (long)*(int *)local_f0[6] * 8);
            if (0 < *(int *)((long)plVar34 + 0x2c)) {
              sVar44 = 0;
              uVar47 = 0;
              local_128._4_4_ = 0;
              local_128._0_4_ = uVar31;
              do {
                uVar1 = *(undefined8 *)
                         (*(long *)(*(long *)(*plVar34 + 0x20) + 8) +
                         (long)*(int *)(plVar34[6] + uVar47 * 4) * 8);
                if ((int)uVar47 == local_128._0_4_) {
                  pvVar26 = *(void **)(puVar28 + 2);
                  if (uVar47 < 0x10) {
                    if (pvVar26 == (void *)0x0) {
                      pvVar26 = malloc(0x80);
                    }
                    else {
                      pvVar26 = realloc(pvVar26,0x80);
                    }
                    *(void **)(puVar28 + 2) = pvVar26;
                    local_128 = 7.90505033345994e-323;
                  }
                  else {
                    if (pvVar26 == (void *)0x0) {
                      pvVar26 = malloc(sVar44);
                    }
                    else {
                      pvVar26 = realloc(pvVar26,sVar44);
                    }
                    *(void **)(puVar28 + 2) = pvVar26;
                    local_128 = (double)(ulong)(uint)(local_128._0_4_ * 2);
                  }
                }
                else {
                  pvVar26 = *(void **)(puVar28 + 2);
                }
                *(undefined8 *)((long)pvVar26 + uVar47 * 8) = uVar1;
                uVar47 = uVar47 + 1;
                sVar44 = sVar44 + 0x10;
              } while ((long)uVar47 < (long)*(int *)((long)plVar34 + 0x2c));
LAB_003430db:
              local_f8 = (ulong)local_128;
              do {
                puVar2 = *(undefined8 **)(puVar28 + 2);
                plVar39 = (long *)*puVar2;
                uVar32 = *(uint *)((long)plVar39 + 0x14) & 0xf;
                if ((3 < uVar32 - 2) && (uVar32 != 7)) {
                  __assert_fail("Abc_ObjIsNode(pNeighbor) || Abc_ObjIsTerm(pNeighbor)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteBook.c"
                                ,0x325,
                                "Abc_Obj_t *Io_NtkBfsPads(Abc_Ntk_t *, Abc_Obj_t *, unsigned int, int *)"
                               );
                }
                lVar45 = (uVar47 & 0xffffffff) + 1;
                puVar14 = puVar2 + (uVar47 & 0xffffffff);
                uVar50 = uVar47 & 0xffffffff;
                do {
                  uVar33 = uVar50;
                  puVar36 = puVar14;
                  if ((int)lVar45 + -1 < 1) {
                    __assert_fail("i >= 0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                                  ,0x318,"void Vec_PtrRemove(Vec_Ptr_t *, void *)");
                  }
                  lVar48 = lVar45 + -1;
                  lVar13 = lVar45 + -2;
                  lVar45 = lVar48;
                  puVar14 = puVar36 + -1;
                  uVar50 = (ulong)((int)uVar33 - 1);
                } while ((long *)puVar2[lVar13] != plVar39);
                uVar32 = (uint)lVar48;
                while ((int)uVar32 < (int)uVar47) {
                  puVar36[-1] = *puVar36;
                  uVar32 = (int)uVar33 + 1;
                  uVar33 = (ulong)uVar32;
                  puVar36 = puVar36 + 1;
                }
                lVar45 = *plVar39;
                iVar17 = (int)plVar39[2];
                Vec_IntFillExtra((Vec_Int_t *)(lVar45 + 0xe0),iVar17 + 1,(int)puVar36);
                if (((long)iVar17 < 0) || (*(int *)(lVar45 + 0xe4) <= iVar17)) {
LAB_00343dae:
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
                }
                uVar47 = (ulong)((int)uVar47 - 1);
                lVar48 = *plVar39;
                iVar41 = *(int *)(lVar48 + 0xd8);
                if (*(int *)(*(long *)(lVar45 + 0xe8) + (long)iVar17 * 4) != iVar41) {
                  iVar17 = (int)plVar39[2];
                  Vec_IntFillExtra((Vec_Int_t *)(lVar48 + 0xe0),iVar17 + 1,Fill);
                  if (((long)iVar17 < 0) || (*(int *)(lVar48 + 0xe4) <= iVar17)) goto LAB_00343dec;
                  *(int *)(*(long *)(lVar48 + 0xe8) + (long)iVar17 * 4) = iVar41;
                  if (((*(uint *)((long)plVar39 + 0x14) & 0xe) == 2) &&
                     (*(int *)((long)pvVar25 + (ulong)*(uint *)(plVar39 + 2) * 4) == 0)) break;
                  uVar50 = extraout_RDX;
                  if (*(int *)((long)plVar39 + 0x2c) != 0) {
                    plVar34 = *(long **)(*(long *)(*(long *)(*plVar39 + 0x20) + 8) +
                                        (long)*(int *)plVar39[6] * 8);
                    if ((pNtk->nObjCounts[8] != 0) && ((*(uint *)((long)plVar34 + 0x14) & 0xf) == 8)
                       ) {
                      plVar34 = *(long **)(*(long *)(*(long *)(*plVar34 + 0x20) + 8) +
                                          (long)*(int *)plVar34[6] * 8);
                      plVar34 = *(long **)(*(long *)(*(long *)(*plVar34 + 0x20) + 8) +
                                          (long)*(int *)plVar34[6] * 8);
                    }
                    if (0 < *(int *)((long)plVar34 + 0x2c)) {
                      lVar45 = 0;
                      do {
                        plVar3 = *(long **)(*(long *)(*(long *)(*plVar34 + 0x20) + 8) +
                                           (long)*(int *)(plVar34[6] + lVar45 * 4) * 8);
                        lVar48 = *plVar3;
                        iVar17 = (int)plVar3[2];
                        Vec_IntFillExtra((Vec_Int_t *)(lVar48 + 0xe0),iVar17 + 1,(int)uVar50);
                        if (((long)iVar17 < 0) || (*(int *)(lVar48 + 0xe4) <= iVar17))
                        goto LAB_00343dae;
                        uVar50 = extraout_RDX_00;
                        if (*(int *)(*(long *)(lVar48 + 0xe8) + (long)iVar17 * 4) !=
                            *(int *)(*plVar3 + 0xd8)) {
                          iVar41 = (int)uVar47;
                          iVar17 = (int)local_f8;
                          if (iVar41 == iVar17) {
                            if (iVar17 < 0x10) {
                              if (*(void **)(puVar28 + 2) == (void *)0x0) {
                                pvVar26 = malloc(0x80);
                                uVar50 = extraout_RDX_03;
                              }
                              else {
                                pvVar26 = realloc(*(void **)(puVar28 + 2),0x80);
                                uVar50 = extraout_RDX_01;
                              }
                              *(void **)(puVar28 + 2) = pvVar26;
                              local_128 = 7.90505033345994e-323;
                              local_f8 = 0x10;
                            }
                            else {
                              local_f8 = CONCAT44(0,iVar17 * 2);
                              if (*(void **)(puVar28 + 2) == (void *)0x0) {
                                pvVar26 = malloc(local_f8 * 8);
                                uVar50 = extraout_RDX_04;
                              }
                              else {
                                pvVar26 = realloc(*(void **)(puVar28 + 2),local_f8 * 8);
                                uVar50 = extraout_RDX_02;
                              }
                              *(void **)(puVar28 + 2) = pvVar26;
                              local_128 = (double)local_f8;
                            }
                          }
                          else {
                            pvVar26 = *(void **)(puVar28 + 2);
                          }
                          uVar47 = (ulong)(iVar41 + 1);
                          *(long **)((long)pvVar26 + (long)iVar41 * 8) = plVar3;
                        }
                        lVar45 = lVar45 + 1;
                      } while (lVar45 < *(int *)((long)plVar34 + 0x2c));
                    }
                  }
                  iVar17 = *(int *)((long)plVar39 + 0x1c);
                  if (iVar17 != 0) {
                    if (pNtk->nObjCounts[8] != 0) {
                      plVar34 = *(long **)(*(long *)(*(long *)(*plVar39 + 0x20) + 8) +
                                          (long)*(int *)plVar39[4] * 8);
                      uVar32 = *(uint *)((long)plVar34 + 0x14) & 0xf;
                      uVar50 = (ulong)uVar32;
                      if (uVar32 == 8) {
                        plVar39 = *(long **)(*(long *)(*(long *)(*plVar34 + 0x20) + 8) +
                                            (long)*(int *)plVar34[4] * 8);
                        iVar17 = *(int *)((long)plVar39 + 0x1c);
                      }
                    }
                    if (0 < iVar17) {
                      lVar45 = 0;
                      do {
                        plVar34 = *(long **)(*(long *)(*(long *)(*plVar39 + 0x20) + 8) +
                                            (long)*(int *)(plVar39[4] + lVar45 * 4) * 8);
                        plVar34 = *(long **)(*(long *)(*(long *)(*plVar34 + 0x20) + 8) +
                                            (long)*(int *)plVar34[4] * 8);
                        lVar48 = *plVar34;
                        iVar17 = (int)plVar34[2];
                        Vec_IntFillExtra((Vec_Int_t *)(lVar48 + 0xe0),iVar17 + 1,(int)uVar50);
                        if (((long)iVar17 < 0) || (*(int *)(lVar48 + 0xe4) <= iVar17))
                        goto LAB_00343dae;
                        uVar50 = extraout_RDX_05;
                        if (*(int *)(*(long *)(lVar48 + 0xe8) + (long)iVar17 * 4) !=
                            *(int *)(*plVar34 + 0xd8)) {
                          iVar41 = (int)uVar47;
                          iVar17 = local_128._0_4_;
                          if (iVar41 == iVar17) {
                            if (iVar17 < 0x10) {
                              if (*(void **)(puVar28 + 2) == (void *)0x0) {
                                pvVar26 = malloc(0x80);
                                uVar50 = extraout_RDX_08;
                              }
                              else {
                                pvVar26 = realloc(*(void **)(puVar28 + 2),0x80);
                                uVar50 = extraout_RDX_06;
                              }
                              *(void **)(puVar28 + 2) = pvVar26;
                              local_128 = 7.90505033345994e-323;
                            }
                            else {
                              local_128 = (double)CONCAT44(0,iVar17 * 2);
                              sVar44 = (long)local_128 * 8;
                              if (*(void **)(puVar28 + 2) == (void *)0x0) {
                                pvVar26 = malloc(sVar44);
                                uVar50 = extraout_RDX_09;
                              }
                              else {
                                pvVar26 = realloc(*(void **)(puVar28 + 2),sVar44);
                                uVar50 = extraout_RDX_07;
                              }
                              *(void **)(puVar28 + 2) = pvVar26;
                            }
                          }
                          else {
                            pvVar26 = *(void **)(puVar28 + 2);
                          }
                          uVar47 = (ulong)(iVar41 + 1);
                          *(long **)((long)pvVar26 + (long)iVar41 * 8) = plVar34;
                          local_f8 = (ulong)local_128;
                        }
                        lVar45 = lVar45 + 1;
                      } while (lVar45 < *(int *)((long)plVar39 + 0x1c));
                    }
                  }
                }
                plVar39 = local_f0;
              } while (0 < (int)uVar47);
            }
          }
          else {
            plVar34 = *(long **)(lVar45 + (long)*(int *)local_f0[4] * 8);
            if (0 < *(int *)((long)plVar34 + 0x1c)) {
              sVar44 = 0;
              uVar47 = 0;
              local_128._4_4_ = 0;
              local_128._0_4_ = uVar31;
              do {
                uVar1 = *(undefined8 *)
                         (*(long *)(*(long *)(*plVar34 + 0x20) + 8) +
                         (long)*(int *)(plVar34[4] + uVar47 * 4) * 8);
                if ((int)uVar47 == local_128._0_4_) {
                  pvVar26 = *(void **)(puVar28 + 2);
                  if (uVar47 < 0x10) {
                    if (pvVar26 == (void *)0x0) {
                      pvVar26 = malloc(0x80);
                    }
                    else {
                      pvVar26 = realloc(pvVar26,0x80);
                    }
                    *(void **)(puVar28 + 2) = pvVar26;
                    local_128 = 7.90505033345994e-323;
                  }
                  else {
                    if (pvVar26 == (void *)0x0) {
                      pvVar26 = malloc(sVar44);
                    }
                    else {
                      pvVar26 = realloc(pvVar26,sVar44);
                    }
                    *(void **)(puVar28 + 2) = pvVar26;
                    local_128 = (double)(ulong)(uint)(local_128._0_4_ * 2);
                  }
                }
                else {
                  pvVar26 = *(void **)(puVar28 + 2);
                }
                *(undefined8 *)((long)pvVar26 + uVar47 * 8) = uVar1;
                uVar47 = uVar47 + 1;
                sVar44 = sVar44 + 0x10;
              } while ((long)uVar47 < (long)*(int *)((long)plVar34 + 0x1c));
              goto LAB_003430db;
            }
          }
          if (0 < (int)uVar35) {
            uVar47 = 0;
            do {
              if (*(long **)(*(long *)(puVar27 + 2) + uVar47 * 8) == plVar39) {
                if ((int)uVar46 <= (int)uVar42) goto LAB_00343dcd;
                uVar47 = local_b8 & 0xffffffff;
                local_b8 = (ulong)(uVar42 + 1);
                local_f0 = *(long **)(*(long *)(piVar24 + 2) + uVar47 * 8);
                bVar49 = false;
                goto LAB_0034367f;
              }
              uVar47 = uVar47 + 1;
            } while (uVar35 != uVar47);
          }
          uVar32 = (uint)local_d0;
          if (uVar35 == uVar32) {
            if ((int)uVar32 < 0x10) {
              if (*(void **)(puVar27 + 2) == (void *)0x0) {
                pvVar26 = malloc(0x80);
              }
              else {
                pvVar26 = realloc(*(void **)(puVar27 + 2),0x80);
              }
              *(void **)(puVar27 + 2) = pvVar26;
              *puVar27 = 0x10;
              local_d0 = 0x10;
            }
            else {
              local_d0 = (ulong)(uVar32 * 2);
              if (*(void **)(puVar27 + 2) == (void *)0x0) {
                pvVar26 = malloc(local_d0 * 8);
              }
              else {
                pvVar26 = realloc(*(void **)(puVar27 + 2),local_d0 * 8);
              }
              *(void **)(puVar27 + 2) = pvVar26;
              *puVar27 = uVar32 * 2;
            }
          }
          else {
            pvVar26 = *(void **)(puVar27 + 2);
          }
          lVar45 = (long)(int)uVar35;
          uVar35 = uVar35 + 1;
          puVar27[1] = uVar35;
          *(long **)((long)pvVar26 + lVar45 * 8) = plVar39;
          *(undefined4 *)((long)pvVar25 + (ulong)*(uint *)(plVar39 + 2) * 4) = 1;
          local_12c = local_12c + 1;
          bVar49 = true;
          local_e4 = (uint)local_d0;
          local_f0 = plVar39;
LAB_0034367f:
          if ((p == (ProgressBar *)0x0) || (p->nItemsNext <= (int)local_12c)) {
            Extra_ProgressBarUpdate_int(p,local_12c,(char *)0x0);
          }
        } while ((local_12c < uVar46) && ((uint)local_b8 < uVar46));
      }
LAB_003436d4:
      Extra_ProgressBarStop(p);
      if (local_12c != uVar46) {
        __assert_fail("termCount==numTerms",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteBook.c"
                      ,0x2fc,"Vec_Ptr_t *Io_NtkOrderingPads(Abc_Ntk_t *, Vec_Ptr_t *)");
      }
      if (uVar35 != uVar16) {
        __assert_fail("termsOnTop+termsOnBottom+termsOnLeft+termsOnRight == (unsigned)Vec_PtrSize(vOrderedTerms)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteBook.c"
                      ,0x26d,"void Io_NtkWritePl(FILE *, Abc_Ntk_t *, unsigned int, double, double)"
                     );
      }
      uVar47 = (ulong)dVar6;
      uVar43 = uVar43 - (int)uVar47;
      puts("Done constructing layout region");
      printf("Terminals: %d\n",uVar40);
      printf("  Top:     %d\n",uVar51);
      printf("  Bottom:  %d\n",uVar51);
      printf("  Left:    %d\n",(ulong)uVar43);
      printf("  Right:   %d\n",uVar47 & 0xffffffff);
      fwrite("UCLA    pl    1.0\n\n",0x13,1,pFVar21);
      uVar38 = 0;
      if (uVar15 != 0) {
        dVar10 = dVar11 / (double)uVar51;
        dVar6 = ceil(dVar7 + 2.0);
        uVar38 = 0;
        if (0 < (int)uVar16) {
          uVar38 = uVar40;
        }
        dVar12 = 0.0;
        uVar40 = 0;
        do {
          if (uVar38 == uVar40) goto LAB_00343dcd;
          lVar45 = *(long *)(puVar27 + 2);
          plVar39 = *(long **)(lVar45 + uVar40 * 8);
          bVar49 = (*(uint *)((long)plVar39 + 0x14) & 0xf) == 2;
          pcVar19 = "o%s_output\t\t";
          if (bVar49) {
            pcVar19 = "i%s_input\t\t";
          }
          pcVar29 = Abc_ObjName(*(Abc_Obj_t **)
                                 (*(long *)(*(long *)(*plVar39 + 0x20) + 8) +
                                 (long)*(int *)plVar39[(ulong)bVar49 * 2 + 4] * 8));
          fprintf(pFVar21,pcVar19,pcVar29);
          if ((uVar40 != 0) && ((int)dVar12 <= (int)(dVar12 - dVar10))) {
            dVar12 = dVar12 + 1.0;
          }
          fprintf(pFVar21,"%d\t\t%d\t: %s /FIXED\n",(ulong)(uint)(int)dVar12,(ulong)(uint)(int)dVar6
                  ,"FS");
          dVar12 = dVar12 + dVar10;
          uVar40 = uVar40 + 1;
        } while (uVar51 != uVar40);
        uVar38 = uVar51;
        if (0 < (int)uVar15) {
          dVar6 = 0.0;
          lVar48 = 0;
          do {
            if ((int)uVar16 <= (int)(uVar15 + (int)lVar48)) goto LAB_00343dcd;
            plVar39 = *(long **)(lVar45 + uVar51 * 8 + lVar48 * 8);
            bVar49 = (*(uint *)((long)plVar39 + 0x14) & 0xf) == 2;
            pcVar19 = "o%s_output\t\t";
            if (bVar49) {
              pcVar19 = "i%s_input\t\t";
            }
            pcVar29 = Abc_ObjName(*(Abc_Obj_t **)
                                   (*(long *)(*(long *)(*plVar39 + 0x20) + 8) +
                                   (long)*(int *)plVar39[(ulong)bVar49 * 2 + 4] * 8));
            fprintf(pFVar21,pcVar19,pcVar29);
            if ((lVar48 != 0) && ((int)dVar6 <= (int)(dVar6 - dVar10))) {
              dVar6 = dVar6 + 1.0;
            }
            fprintf(pFVar21,"%d\t\t%d\t: %s /FIXED\n",(ulong)(uint)(int)dVar6,0xfffffffd,"N");
            dVar6 = dVar6 + dVar10;
            lVar48 = lVar48 + 1;
          } while (uVar15 != (uint)lVar48);
          uVar38 = (ulong)(uVar15 * 2);
        }
      }
      uVar40 = uVar38;
      if ((uint)uVar38 < uVar15 * 2 + uVar43) {
        dVar10 = dVar7 / (double)uVar43;
        uVar40 = (ulong)(uVar16 - (int)uVar47);
        dVar6 = 0.0;
        uVar52 = 0;
        uVar53 = 0;
        do {
          auVar4._8_4_ = uVar52;
          auVar4._0_8_ = dVar6;
          auVar4._12_4_ = uVar53;
          if ((int)uVar16 <= (int)uVar38) goto LAB_00343dcd;
          plVar39 = *(long **)(*(long *)(puVar27 + 2) + uVar38 * 8);
          bVar49 = (*(uint *)((long)plVar39 + 0x14) & 0xf) == 2;
          pcVar19 = "o%s_output\t\t";
          if (bVar49) {
            pcVar19 = "i%s_input\t\t";
          }
          pcVar29 = Abc_ObjName(*(Abc_Obj_t **)
                                 (*(long *)(*(long *)(*plVar39 + 0x20) + 8) +
                                 (long)*(int *)plVar39[(ulong)bVar49 * 2 + 4] * 8));
          fprintf(pFVar21,pcVar19,pcVar29);
          dStack_120 = auVar4._8_8_;
          uVar50 = -(ulong)((double)(int)dVar6 < (double)(int)(dVar6 - dVar10) + 1.0);
          uVar51 = (ulong)dStack_120 & (ulong)(double)(int)dStack_120;
          auVar54._0_8_ = ~uVar50 & (ulong)dVar6;
          auVar54._8_8_ = ~(ulong)(double)(int)dStack_120 & (ulong)dStack_120;
          auVar8._8_4_ = (int)uVar51;
          auVar8._0_8_ = (ulong)(dVar6 + 1.0) & uVar50;
          auVar8._12_4_ = (int)(uVar51 >> 0x20);
          auVar54 = auVar54 | auVar8;
          fprintf(pFVar21,"%d\t\t%d\t: %s /FIXED\n",0xfffffffd,(ulong)(uint)(int)auVar54._0_8_,"E");
          uVar52 = auVar54._8_4_;
          uVar53 = auVar54._12_4_;
          dVar6 = auVar54._0_8_ + dVar10;
          uVar38 = uVar38 + 1;
        } while (uVar40 != uVar38);
      }
      if ((uint)uVar40 < uVar16) {
        dVar7 = dVar7 / (double)(uVar47 & 0xffffffff);
        dVar6 = ceil(dVar11 + 2.0);
        dVar10 = 0.0;
        uVar52 = 0;
        uVar53 = 0;
        uVar38 = uVar40;
        do {
          auVar5._8_4_ = uVar52;
          auVar5._0_8_ = dVar10;
          auVar5._12_4_ = uVar53;
          if ((int)uVar16 <= (int)uVar40) goto LAB_00343dcd;
          plVar39 = *(long **)(*(long *)(puVar27 + 2) + uVar38 * 8);
          bVar49 = (*(uint *)((long)plVar39 + 0x14) & 0xf) == 2;
          pcVar19 = "o%s_output\t\t";
          if (bVar49) {
            pcVar19 = "i%s_input\t\t";
          }
          pcVar29 = Abc_ObjName(*(Abc_Obj_t **)
                                 (*(long *)(*(long *)(*plVar39 + 0x20) + 8) +
                                 (long)*(int *)plVar39[(ulong)bVar49 * 2 + 4] * 8));
          fprintf(pFVar21,pcVar19,pcVar29);
          dStack_140 = auVar5._8_8_;
          uVar51 = -(ulong)((double)(int)dVar10 < (double)(int)(dVar10 - dVar7) + 1.0);
          uVar47 = (ulong)dStack_140 & (ulong)(double)(int)dStack_140;
          auVar55._0_8_ = ~uVar51 & (ulong)dVar10;
          auVar55._8_8_ = ~(ulong)(double)(int)dStack_140 & (ulong)dStack_140;
          auVar9._8_4_ = (int)uVar47;
          auVar9._0_8_ = (ulong)(dVar10 + 1.0) & uVar51;
          auVar9._12_4_ = (int)(uVar47 >> 0x20);
          auVar55 = auVar55 | auVar9;
          fprintf(pFVar21,"%d\t\t%d\t: %s /FIXED\n",(ulong)(uint)(int)dVar6,
                  (ulong)(uint)(int)auVar55._0_8_,"FW");
          uVar52 = auVar55._8_4_;
          uVar53 = auVar55._12_4_;
          dVar10 = auVar55._0_8_ + dVar7;
          uVar38 = uVar38 + 1;
          uVar15 = (int)uVar40 + 1;
          uVar40 = (ulong)uVar15;
        } while (uVar16 != uVar15);
      }
      if ((pNtk->nObjCounts[8] != 0) && (pVVar30 = pNtk->vBoxes, 0 < pVVar30->nSize)) {
        lVar45 = 0;
        do {
          if ((*(uint *)&((Abc_Obj_t *)pVVar30->pArray[lVar45])->field_0x14 & 0xf) == 8) {
            Io_NtkWriteLatchNode((FILE *)pFVar21,(Abc_Obj_t *)pVVar30->pArray[lVar45],1);
            fprintf(pFVar21,"\t%d\t\t%d\t: %s\n",0,0,"N");
            pVVar30 = pNtk->vBoxes;
          }
          lVar45 = lVar45 + 1;
        } while (lVar45 < pVVar30->nSize);
      }
      pVVar30 = pNtk->vObjs;
      if (0 < pVVar30->nSize) {
        lVar45 = 0;
        do {
          pNode = (Abc_Obj_t *)pVVar30->pArray[lVar45];
          if ((pNode != (Abc_Obj_t *)0x0) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) {
            Io_NtkWriteIntNode((FILE *)pFVar21,pNode,1);
            fprintf(pFVar21,"\t%d\t\t%d\t: %s\n",0,0,"N");
            pVVar30 = pNtk->vObjs;
          }
          lVar45 = lVar45 + 1;
        } while (lVar45 < pVVar30->nSize);
      }
      fclose(pFVar20);
      fclose(pFVar21);
      fclose(pFVar22);
      return;
    }
  }
LAB_00343dcd:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Io_WriteBook( Abc_Ntk_t * pNtk, char * FileName )
{

    FILE * pFileNodes, * pFileNets, * pFileAux;
    FILE * pFileScl, * pFilePl, * pFileWts;
    char * FileExt = ABC_CALLOC( char, strlen(FileName)+7 );
    unsigned coreCellArea=0;
    Abc_Ntk_t * pExdc, * pNtkTemp;
    int i;

    assert( Abc_NtkIsNetlist(pNtk) );
    // start writing the files
    strcpy(FileExt, FileName);
    pFileNodes = fopen( strcat(FileExt,".nodes"), "w" );
    strcpy(FileExt, FileName);
    pFileNets  = fopen( strcat(FileExt,".nets"), "w" );
    strcpy(FileExt, FileName);
    pFileAux   = fopen( strcat(FileExt,".aux"), "w" );

        // write the aux file
    if ( (pFileNodes == NULL) || (pFileNets == NULL) || (pFileAux == NULL) )
    {
        fclose( pFileAux );
        fprintf( stdout, "Io_WriteBook(): Cannot open the output files.\n" );
        return;
    }
    fprintf( pFileAux, "RowBasedPlacement : %s.nodes %s.nets %s.scl %s.pl %s.wts", 
         FileName, FileName, FileName, FileName, FileName );
    fclose( pFileAux );

    // write the master network
    coreCellArea+=Io_NtkWriteNodes( pFileNodes, pNtk );
    Io_NtkWriteNets( pFileNets, pNtk );

    // write EXDC network if it exists
    pExdc = Abc_NtkExdc( pNtk );
    if ( pExdc )
    {
    coreCellArea+=Io_NtkWriteNodes( pFileNodes, pNtk );
        Io_NtkWriteNets( pFileNets, pNtk );
    }

    // make sure there is no logic hierarchy
    assert( Abc_NtkWhiteboxNum(pNtk) == 0 );

    // write the hierarchy if present
    if ( Abc_NtkBlackboxNum(pNtk) > 0 )
    {
        Vec_PtrForEachEntry( Abc_Ntk_t *, pNtk->pDesign->vModules, pNtkTemp, i )
        {
            if ( pNtkTemp == pNtk )
                continue;
            coreCellArea+=Io_NtkWriteNodes( pFileNodes, pNtkTemp );
            Io_NtkWriteNets( pFileNets, pNtkTemp );
        }
    }
    fclose( pFileNodes );
    fclose( pFileNets );

    strcpy(FileExt, FileName);
    pFileScl = fopen( strcat(FileExt,".scl"), "w" );
    strcpy(FileExt, FileName);
    pFilePl  = fopen( strcat(FileExt,".pl"), "w" );
    strcpy(FileExt, FileName);
    pFileWts   = fopen( strcat(FileExt,".wts"), "w" );
    ABC_FREE(FileExt);

    Io_NtkBuildLayout( pFileScl, pFilePl, pNtk, 1.0, 10, coreCellArea );
    fclose( pFileScl );
    fclose( pFilePl );
    fclose( pFileWts );
}